

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::currentChanged(QFileDialogPrivate *this,QModelIndex *index)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  long in_FS_OFFSET;
  QArrayData *local_60 [3];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  void *local_28;
  QArrayData **ppQStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  updateOkButton(this);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x90))(&local_48,pQVar2,index,0x101);
  }
  ::QVariant::toString();
  local_28 = (void *)0x0;
  ppQStack_20 = local_60;
  QMetaObject::activate(pQVar1,&QFileDialog::staticMetaObject,2,&local_28);
  if (local_60[0] != (QArrayData *)0x0) {
    LOCK();
    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60[0],2,0x10);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::currentChanged(const QModelIndex &index)
{
    updateOkButton();
    emit q_func()->currentChanged(index.data(QFileSystemModel::FilePathRole).toString());
}